

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_mp3_bind_seek_table
                    (ma_dr_mp3 *pMP3,ma_uint32 seekPointCount,ma_dr_mp3_seek_point *pSeekPoints)

{
  ma_dr_mp3_seek_point *pmVar1;
  ma_uint32 mVar2;
  
  if (pMP3 != (ma_dr_mp3 *)0x0) {
    mVar2 = seekPointCount;
    if (pSeekPoints == (ma_dr_mp3_seek_point *)0x0) {
      mVar2 = 0;
    }
    pmVar1 = (ma_dr_mp3_seek_point *)0x0;
    if (seekPointCount != 0) {
      pmVar1 = pSeekPoints;
    }
    pMP3->seekPointCount = mVar2;
    pMP3->pSeekPoints = pmVar1;
    return 1;
  }
  return 0;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_bind_seek_table(ma_dr_mp3* pMP3, ma_uint32 seekPointCount, ma_dr_mp3_seek_point* pSeekPoints)
{
    if (pMP3 == NULL) {
        return MA_FALSE;
    }
    if (seekPointCount == 0 || pSeekPoints == NULL) {
        pMP3->seekPointCount = 0;
        pMP3->pSeekPoints = NULL;
    } else {
        pMP3->seekPointCount = seekPointCount;
        pMP3->pSeekPoints = pSeekPoints;
    }
    return MA_TRUE;
}